

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

UniDirectionalLSTMLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::_internal_mutable_unidirectionallstm
          (NeuralNetworkLayer *this)

{
  bool bVar1;
  Arena *arena;
  UniDirectionalLSTMLayerParams *pUVar2;
  NeuralNetworkLayer *this_local;
  
  bVar1 = _internal_has_unidirectionallstm(this);
  if (!bVar1) {
    clear_layer(this);
    set_has_unidirectionallstm(this);
    arena = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
    pUVar2 = google::protobuf::MessageLite::
             CreateMaybeMessage<CoreML::Specification::UniDirectionalLSTMLayerParams>(arena);
    (this->layer_).unidirectionallstm_ = pUVar2;
  }
  return (UniDirectionalLSTMLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::UniDirectionalLSTMLayerParams* NeuralNetworkLayer::_internal_mutable_unidirectionallstm() {
  if (!_internal_has_unidirectionallstm()) {
    clear_layer();
    set_has_unidirectionallstm();
    layer_.unidirectionallstm_ = CreateMaybeMessage< ::CoreML::Specification::UniDirectionalLSTMLayerParams >(GetArenaForAllocation());
  }
  return layer_.unidirectionallstm_;
}